

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastSqrt(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int b;
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  uint nSize;
  ulong uVar8;
  int Carry;
  int *local_90;
  Gia_Man_t *local_88;
  long local_80;
  Vec_Int_t *local_78;
  long local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  Carry = -1;
  local_88 = pNew;
  local_58 = pNum;
  if ((nNum & 1U) == 0) {
    nSize = nNum >> 1;
    Vec_IntFill(vRes,nSize,0);
    Vec_IntFill(vTmp,nNum * 2,0);
    local_40 = vRes->pArray;
    piVar5 = vTmp->pArray;
    local_70 = (long)nNum;
    local_90 = piVar5 + local_70;
    local_50 = (ulong)nSize;
    if ((int)nSize < 1) {
      local_50 = 0;
    }
    uVar6 = 3;
    local_80 = 1;
    uVar7 = 0;
    local_78 = vRes;
    local_68 = piVar5;
    local_60 = local_40;
    while (piVar3 = local_40 + 1, uVar7 != local_50) {
      lVar2 = local_70 + uVar7 * -2;
      *local_90 = local_58[lVar2 + -2];
      local_90[1] = local_58[lVar2 + -1];
      for (lVar2 = 0; local_80 != lVar2; lVar2 = lVar2 + 1) {
        local_90[lVar2 + 2] = piVar5[lVar2];
      }
      local_48 = uVar7 + 1;
      local_38 = uVar7 + 2;
      local_40 = piVar3;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = local_90[uVar8];
        if (uVar8 < local_38 && 1 < uVar8) {
          b = Abc_LitNot(*piVar3);
          iVar4 = Carry;
        }
        else {
          iVar4 = 1;
          if (uVar8 != 0) {
            iVar4 = Carry;
          }
          b = Abc_LitNot(iVar4);
          iVar4 = 1;
        }
        Wlc_BlastFullAdder(local_88,iVar1,b,iVar4,&Carry,piVar5);
        if (uVar7 <= (int)uVar8 - 1) {
          Carry = Abc_LitNot(Carry);
        }
        piVar5 = piVar5 + 1;
        piVar3 = piVar3 + -1;
      }
      iVar1 = Abc_LitNot(Carry);
      piVar3 = local_60;
      piVar5 = local_68;
      local_60[uVar7] = iVar1;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = Gia_ManHashMux(local_88,piVar3[uVar7],piVar5[uVar8],local_90[uVar8]);
        piVar5[uVar8] = iVar1;
      }
      local_80 = local_80 + 1;
      uVar6 = uVar6 + 1;
      uVar7 = local_48;
    }
    iVar1 = -1;
    for (lVar2 = 0; lVar2 < local_78->nSize / 2; lVar2 = lVar2 + 1) {
      piVar5 = local_78->pArray;
      iVar4 = piVar5[lVar2];
      piVar5[lVar2] = piVar5[local_78->nSize + iVar1];
      piVar5[local_78->nSize + iVar1] = iVar4;
      iVar1 = iVar1 + -1;
    }
    return;
  }
  __assert_fail("nNum % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x254,"void Wlc_BlastSqrt(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastSqrt( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pRes, * pSum, * pSumP;
    int i, k, Carry = -1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pRes = Vec_IntArray( vRes );
    pSum = Vec_IntArray( vTmp );
    pSumP = pSum + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        pSumP[0] = pNum[nNum-2*i-2];
        pSumP[1] = pNum[nNum-2*i-1];
        for ( k = 0; k < i+1; k++ )
            pSumP[k+2] = pSum[k];
        for ( k = 0; k < i + 3; k++ )
        {
            if ( k >= 2 && k < i + 2 ) // middle ones
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(pRes[i-k+1]), Carry, &Carry, &pSum[k] );
            else
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(k ? Carry:1), 1,     &Carry, &pSum[k] );
            if ( k == 0 || k > i )
                Carry = Abc_LitNot(Carry);
        }
        pRes[i] = Abc_LitNot(Carry);
        for ( k = 0; k < i + 3; k++ )
            pSum[k] = Gia_ManHashMux( pNew, pRes[i], pSum[k], pSumP[k] );
    }
    Vec_IntReverseOrder( vRes );
}